

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

void Diligent::ProcessIncludeErrorHandler(ShaderCreateInfo *ShaderCI,string *Error)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  undefined1 local_38 [8];
  string FileInfo;
  string *Error_local;
  ShaderCreateInfo *ShaderCI_local;
  
  FileInfo.field_2._8_8_ = Error;
  std::__cxx11::string::string((string *)local_38);
  if (ShaderCI->FilePath == (Char *)0x0) {
    if ((ShaderCI->Desc).super_DeviceObjectAttribs.Name != (Char *)0x0) {
      std::__cxx11::string::operator=((string *)local_38,"shader \'");
      std::__cxx11::string::operator+=
                ((string *)local_38,(ShaderCI->Desc).super_DeviceObjectAttribs.Name);
      std::__cxx11::string::operator+=((string *)local_38,'\'');
    }
  }
  else {
    std::__cxx11::string::operator=((string *)local_38,"file \'");
    std::__cxx11::string::operator+=((string *)local_38,ShaderCI->FilePath);
    std::__cxx11::string::operator+=((string *)local_38,'\'');
  }
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)__cxa_allocate_exception(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             FileInfo.field_2._8_8_);
  __cxa_throw(this,&std::pair<std::__cxx11::string,std::__cxx11::string>::typeinfo,
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair);
}

Assistant:

static void ProcessIncludeErrorHandler(const ShaderCreateInfo& ShaderCI, const std::string& Error) noexcept(false)
{
    std::string FileInfo;
    if (ShaderCI.FilePath != nullptr)
    {
        FileInfo = "file '";
        FileInfo += ShaderCI.FilePath;
        FileInfo += '\'';
    }
    else if (ShaderCI.Desc.Name != nullptr)
    {
        FileInfo = "shader '";
        FileInfo += ShaderCI.Desc.Name;
        FileInfo += '\'';
    }
    throw std::pair<std::string, std::string>{std::move(FileInfo), Error};
}